

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O2

json Ps2Tt(json *glyf,double errorBound)

{
  pointer pbVar1;
  Coeff1 coeff;
  Segment s;
  Segment s_00;
  Segment s_01;
  json *this;
  Point PVar2;
  pointer pdVar3;
  bool bVar4;
  string_type *key;
  reference pbVar5;
  reference pvVar6;
  reference this_00;
  size_type sVar7;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar8;
  const_reference this_01;
  long lVar9;
  json_value extraout_RDX;
  iterator __begin1_2;
  pointer pdVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  _Base_ptr p_Var13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  _Base_ptr p_Var18;
  double dVar19;
  _Alloc_hider _Var20;
  double dVar21;
  double dVar22;
  _Alloc_hider _Var23;
  double dVar24;
  json jVar25;
  initializer_list_t init;
  key_type local_408;
  undefined1 local_3e8 [16];
  double local_3d8;
  double dStack_3d0;
  json *local_3c8;
  double local_3c0;
  Point local_3b8;
  Point local_3a8;
  Solution inflections;
  const_iterator q;
  Solution result_;
  undefined8 uStack_340;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2c8;
  _Base_ptr local_2b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbStack_2b0;
  difference_type local_2a8;
  double local_298;
  double dStack_290;
  pointer local_288;
  _Base_ptr p_Stack_280;
  pointer local_278;
  _Base_ptr p_Stack_270;
  pointer local_268;
  _Base_ptr p_Stack_260;
  const_iterator beg;
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_1f8;
  json quadContour;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1e0;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1c0;
  anon_class_64_2_4710b9f6 advance;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_160;
  iterator __end1_1;
  iterator __begin1_1;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __end1;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin1;
  
  local_3c8 = glyf;
  local_3c0 = errorBound;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(glyf,(nullptr_t)0x0);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::begin(&__begin1,&local_1f8);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::end(&__end1,&local_1f8);
  while( true ) {
    bVar4 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(&__begin1.anchor,&__end1.anchor);
    if (!bVar4) break;
    key = nlohmann::detail::
          iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::key(&__begin1);
    pbVar5 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&__begin1.anchor);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_2c8,pbVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"stemH",(allocator<char> *)&result_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase(&local_2c8,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"stemV",(allocator<char> *)&result_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase(&local_2c8,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"hintMasks",(allocator<char> *)&result_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase(&local_2c8,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"contourMasks",(allocator<char> *)&result_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::erase(&local_2c8,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_2c8,"contours");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin(&__begin1_1,pvVar6);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end(&__end1_1,pvVar6);
    while( true ) {
      bVar4 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=(&__begin1_1,&__end1_1);
      if (!bVar4) break;
      this_00 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator*(&__begin1_1);
      sVar7 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::size(this_00);
      if (1 < sVar7) {
        init._M_len = 0;
        init._M_array = (iterator)&quadContour;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::array(init);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin(&beg,this_00);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend((const_iterator *)&local_408,this_00);
        piVar8 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator--((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_408);
        pbVar1 = piVar8->m_object;
        local_2a8 = (piVar8->m_it).primitive_iterator.m_it;
        local_2b8 = (piVar8->m_it).object_iterator._M_node;
        pbStack_2b0 = (piVar8->m_it).array_iterator._M_current;
        sVar7 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::size(this_00);
        q.m_object = beg.m_object;
        q.m_it.primitive_iterator = beg.m_it.primitive_iterator;
        q.m_it.object_iterator = beg.m_it.object_iterator;
        q.m_it.array_iterator = beg.m_it.array_iterator;
        pbVar5 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&q);
        Point::Point((Point *)&local_408,pbVar5);
        local_3a8.y = (double)local_408._M_string_length;
        local_3a8.x = (double)local_408._M_dataplus._M_p;
        ConstructTtPath::Move((ConstructTtPath *)&quadContour,pbVar5,local_3a8);
        advance.beg.m_object = beg.m_object;
        advance.beg.m_it.primitive_iterator = beg.m_it.primitive_iterator;
        advance.beg.m_it.object_iterator = beg.m_it.object_iterator;
        advance.beg.m_it.array_iterator = beg.m_it.array_iterator;
        advance.end.m_it.primitive_iterator.m_it = local_2a8;
        advance.end.m_it.object_iterator._M_node = local_2b8;
        advance.end.m_it.array_iterator._M_current = pbStack_2b0;
        advance.end.m_object = pbVar1;
        while( true ) {
          if (sVar7 == 0) break;
          local_1c0.m_object = q.m_object;
          local_1c0.m_it.primitive_iterator.m_it = q.m_it.primitive_iterator.m_it;
          local_1c0.m_it.object_iterator._M_node = q.m_it.object_iterator._M_node;
          local_1c0.m_it.array_iterator._M_current = q.m_it.array_iterator._M_current;
          Convert(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,double)
          ::$_0::operator()((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)&local_408,(__0 *)&advance,&local_1c0);
          q.m_object = (pointer)local_408._M_dataplus._M_p;
          q.m_it.primitive_iterator.m_it = local_408.field_2._8_8_;
          q.m_it.object_iterator._M_node = (_Base_ptr)local_408._M_string_length;
          q.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_408.field_2._M_allocated_capacity;
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*(&q);
          this_01 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)pbVar5,"on");
          bVar4 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<bool,_bool,_0>(this_01);
          if (bVar4) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&q);
            Point::Point((Point *)&local_408,pbVar5);
            local_3b8.y = (double)local_408._M_string_length;
            local_3b8.x = (double)local_408._M_dataplus._M_p;
            ConstructTtPath::Line((ConstructTtPath *)&quadContour,pbVar5,local_3b8);
            lVar9 = -1;
          }
          else {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&q);
            Point::Point((Point *)&local_408,pbVar5);
            p_Var13 = (_Base_ptr)local_408._M_string_length;
            _Var20._M_p = local_408._M_dataplus._M_p;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator--(&q);
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&q);
            Point::Point((Point *)&local_408,pbVar5);
            p_Var18 = (_Base_ptr)local_408._M_string_length;
            _Var23._M_p = local_408._M_dataplus._M_p;
            local_1e0.m_object = q.m_object;
            local_1e0.m_it.primitive_iterator.m_it = q.m_it.primitive_iterator.m_it;
            local_1e0.m_it.object_iterator._M_node = q.m_it.object_iterator._M_node;
            local_1e0.m_it.array_iterator._M_current = q.m_it.array_iterator._M_current;
            Convert(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,double)
            ::$_0::operator()((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_408,(__0 *)&advance,&local_1e0);
            q.m_object = (pointer)local_408._M_dataplus._M_p;
            q.m_it.primitive_iterator.m_it = local_408.field_2._8_8_;
            q.m_it.object_iterator._M_node = (_Base_ptr)local_408._M_string_length;
            q.m_it.array_iterator._M_current =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_408.field_2._M_allocated_capacity;
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*(&q);
            Point::Point((Point *)&local_408,pbVar5);
            local_288 = (pointer)_Var20._M_p;
            p_Stack_280 = p_Var13;
            local_278 = (pointer)_Var23._M_p;
            p_Stack_270 = p_Var18;
            local_298 = local_3a8.x;
            dStack_290 = local_3a8.y;
            local_268 = (pointer)local_408._M_dataplus._M_p;
            p_Stack_260 = (_Base_ptr)local_408._M_string_length;
            dVar19 = (double)p_Var18 * -3.0;
            local_408.field_2._M_allocated_capacity =
                 (size_type)
                 (((((double)p_Var13 - ((double)p_Var18 + (double)p_Var18)) +
                   (double)local_408._M_string_length) * local_3a8.x +
                  ((double)_Var23._M_p *
                   ((double)p_Var13 * -3.0 + local_3a8.y + local_3a8.y +
                   (double)local_408._M_string_length) -
                  ((local_3a8.y - ((double)p_Var13 + (double)p_Var13)) + (double)p_Var18) *
                  (double)local_408._M_dataplus._M_p)) -
                 ((double)local_408._M_string_length + (double)local_408._M_string_length +
                 dVar19 + local_3a8.y) * (double)_Var20._M_p);
            local_3b8.y = (double)local_408._M_string_length;
            local_3b8.x = (double)local_408._M_dataplus._M_p;
            dVar16 = (double)local_408._M_dataplus._M_p * (local_3a8.y - (double)p_Var13);
            local_408._M_dataplus._M_p =
                 (pointer)((double)_Var20._M_p * ((double)p_Var18 - local_3a8.y) +
                          (local_3a8.y - (double)p_Var13) * (double)_Var23._M_p +
                          ((double)p_Var13 - (double)p_Var18) * local_3a8.x);
            local_408._M_string_length =
                 (size_type)
                 (-local_3a8.x *
                  (dVar19 + (double)p_Var13 + (double)p_Var13 + (double)local_408._M_string_length)
                 + (local_3a8.y + local_3a8.y + dVar19 + (double)local_408._M_string_length) *
                   (double)_Var20._M_p +
                   dVar16 + ((double)p_Var13 - local_3a8.y) * (double)_Var23._M_p * 3.0);
            local_408.field_2._8_8_ = 0;
            coeff._M_elems[1] = (double)local_408._M_string_length;
            coeff._M_elems[0] = (double)local_408._M_dataplus._M_p;
            coeff._M_elems[2] = (double)local_408.field_2._M_allocated_capacity;
            coeff._M_elems[3] = 0.0;
            QuadSolve(coeff);
            pdVar3 = result_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (pdVar10 = result_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start; pdVar10 != pdVar3;
                pdVar10 = pdVar10 + 1) {
              if ((1e-06 < *pdVar10) && (*pdVar10 < 0.999999)) {
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)
                           &inflections.super__Vector_base<double,_std::allocator<double>_>,pdVar10)
                ;
              }
            }
            std::
            __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&result_.super__Vector_base<double,_std::allocator<double>_>);
            pdVar3 = inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              s_01._M_elems[0].y = dStack_290;
              s_01._M_elems[0].x = local_298;
              s_01._M_elems[1].x = (double)local_288;
              s_01._M_elems[1].y = (double)p_Stack_280;
              s_01._M_elems[2].x = (double)local_278;
              s_01._M_elems[2].y = (double)p_Stack_270;
              s_01._M_elems[3].x = (double)local_268;
              s_01._M_elems[3].y = (double)p_Stack_260;
              ApproximateSimpleSegment(s_01,&quadContour,local_3c0);
            }
            else {
              uVar11 = 0;
              uVar12 = 0;
              for (pdVar10 = inflections.super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_start; PVar2 = local_3a8, pdVar10 != pdVar3
                  ; pdVar10 = pdVar10 + 1) {
                dVar16 = *pdVar10;
                dVar14 = 1.0 - (1.0 - dVar16) / (1.0 - (double)CONCAT44(uVar12,uVar11));
                dVar22 = 1.0 - dVar14;
                dVar19 = (double)_Var20._M_p * dVar22 + (double)_Var23._M_p * dVar14;
                dVar15 = (double)p_Var18 * dVar14 + (double)p_Var13 * dVar22;
                _Var23._M_p = (pointer)(local_3b8.x * dVar14 + (double)_Var23._M_p * dVar22);
                dVar24 = local_3a8.y * dVar22 + (double)p_Var13 * dVar14;
                dVar17 = local_3a8.x * dVar22 + (double)_Var20._M_p * dVar14;
                p_Var18 = (_Base_ptr)(local_3b8.y * dVar14 + (double)p_Var18 * dVar22);
                _Var20._M_p = (pointer)(dVar14 * (double)_Var23._M_p + dVar22 * dVar19);
                dVar21 = dVar22 * dVar24 + dVar14 * dVar15;
                dVar19 = dVar22 * dVar17 + dVar19 * dVar14;
                p_Var13 = (_Base_ptr)(dVar14 * (double)p_Var18 + dVar15 * dVar22);
                local_3d8 = dVar22 * dVar19 + dVar14 * (double)_Var20._M_p;
                dStack_3d0 = dVar14 * (double)p_Var13 + dVar22 * dVar21;
                local_408._M_dataplus._M_p = (pointer)local_3a8.x;
                local_408._M_string_length = (size_type)local_3a8.y;
                local_408.field_2._8_4_ = SUB84(dVar24,0);
                local_408.field_2._M_allocated_capacity = (size_type)dVar17;
                local_408.field_2._12_4_ = (int)((ulong)dVar24 >> 0x20);
                local_3e8._8_4_ = SUB84(dVar21,0);
                local_3e8._0_8_ = dVar19;
                local_3e8._12_4_ = (int)((ulong)dVar21 >> 0x20);
                local_3a8.y = dStack_3d0;
                local_3a8.x = local_3d8;
                s._M_elems[1].x = dVar17;
                s._M_elems[0] = PVar2;
                s._M_elems[1].y = (double)local_408.field_2._8_8_;
                s._M_elems[2].x = dVar19;
                s._M_elems[2].y = (double)local_3e8._8_8_;
                s._M_elems[3].x = local_3d8;
                s._M_elems[3].y = dStack_3d0;
                ApproximateSimpleSegment(s,&quadContour,local_3c0);
                uVar11 = SUB84(dVar16,0);
                uVar12 = (undefined4)((ulong)dVar16 >> 0x20);
              }
              result_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_3a8.x;
              result_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_3a8.y;
              unique0x10000778 = (int)p_Var13;
              result_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = _Var20._M_p;
              unique0x1000077c = (int)((ulong)p_Var13 >> 0x20);
              s_00._M_elems[1].x = (double)_Var20._M_p;
              s_00._M_elems[0] = local_3a8;
              s_00._M_elems[1].y = (double)uStack_340;
              s_00._M_elems[2].x = (double)_Var23._M_p;
              s_00._M_elems[2].y = (double)p_Var18;
              s_00._M_elems[3].x = local_3b8.x;
              s_00._M_elems[3].y = local_3b8.y;
              ApproximateSimpleSegment(s_00,&quadContour,local_3c0);
            }
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&inflections.super__Vector_base<double,_std::allocator<double>_>);
            lVar9 = -3;
          }
          sVar7 = sVar7 + lVar9;
          local_3a8.x._4_4_ = local_3b8.x._4_4_;
          local_3a8.x._0_4_ = local_3b8.x._0_4_;
          local_3a8.y._0_4_ = local_3b8.y._0_4_;
          local_3a8.y._4_4_ = local_3b8.y._4_4_;
        }
        ConstructTtPath::Finish(&quadContour);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json(&local_160,&quadContour);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(this_00,&local_160);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_160);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&quadContour);
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&__begin1_1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_2d8,&local_2c8);
    this = local_3c8;
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](local_3c8,key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar6,&local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_2d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_2c8);
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this,key);
    RoundInPlace(pvVar6);
    nlohmann::detail::
    iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::~iteration_proxy_value(&__end1);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::~iteration_proxy_value(&__begin1);
  jVar25.m_value.object = extraout_RDX.object;
  jVar25._0_8_ = local_3c8;
  return jVar25;
}

Assistant:

json Ps2Tt(const json &glyf, double errorBound)
{
	json glyfQuad;
	for (const auto &[name, glyph] : glyf.items())
	{
		glyfQuad[name] = Convert(glyph, errorBound);
		RoundInPlace(glyfQuad[name]);
	}
	return glyfQuad;
}